

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

curl_hash_element * mk_hash_element(void *key,size_t key_len,void *p)

{
  void *__dest;
  void *dupkey;
  curl_hash_element *he;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  
  dupkey = (*Curl_cmalloc)(0x18);
  if ((undefined8 *)dupkey != (undefined8 *)0x0) {
    __dest = (*Curl_cmalloc)(key_len);
    if (__dest == (void *)0x0) {
      (*Curl_cfree)(dupkey);
      dupkey = (void *)0x0;
    }
    else {
      memcpy(__dest,key,key_len);
      *(void **)((long)dupkey + 8) = __dest;
      *(size_t *)((long)dupkey + 0x10) = key_len;
      *(void **)dupkey = p;
    }
  }
  return (curl_hash_element *)dupkey;
}

Assistant:

static struct curl_hash_element *
mk_hash_element(const void *key, size_t key_len, const void *p)
{
  struct curl_hash_element *he = malloc(sizeof(struct curl_hash_element));

  if(he) {
    void *dupkey = malloc(key_len);
    if(dupkey) {
      /* copy the key */
      memcpy(dupkey, key, key_len);

      he->key = dupkey;
      he->key_len = key_len;
      he->ptr = (void *) p;
    }
    else {
      /* failed to duplicate the key, free memory and fail */
      free(he);
      he = NULL;
    }
  }
  return he;
}